

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void debugcode(char *fmt,...)

{
  identlink *piVar1;
  char in_AL;
  identlink **ppiVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar3;
  undefined8 in_RSI;
  char *fmt_00;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (nodebug == 0) {
    args[0].reg_save_area = local_e8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 8;
    args[0].fp_offset = 0x30;
    local_e0 = in_RSI;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    conoutfv(4,fmt,args);
    if (dbgalias != 0) {
      uVar3 = 0;
      for (ppiVar2 = &aliasstack; *ppiVar2 != &noalias; ppiVar2 = &(*ppiVar2)->next) {
        uVar3 = uVar3 + 1;
      }
      iVar4 = 1;
      ppiVar2 = &aliasstack;
      while (piVar1 = *ppiVar2, piVar1 != &noalias) {
        fmt_00 = "  %d) %s";
        if (iVar4 < dbgalias) {
LAB_0012a3e2:
          conoutf(4,fmt_00,(ulong)uVar3,piVar1->id->name);
        }
        else if (piVar1->next == &noalias) {
          fmt_00 = "  ..%d) %s";
          if (iVar4 == dbgalias) {
            fmt_00 = "  %d) %s";
          }
          goto LAB_0012a3e2;
        }
        uVar3 = uVar3 - 1;
        iVar4 = iVar4 + 1;
        ppiVar2 = &piVar1->next;
      }
    }
  }
  return;
}

Assistant:

static void debugcode(const char *fmt, ...)
{
    if(nodebug) return;

    va_list args;
    va_start(args, fmt);
    conoutfv(CON_ERROR, fmt, args);
    va_end(args);

    if(!dbgalias) return;
    int total = 0, depth = 0;
    for(identlink *l = aliasstack; l != &noalias; l = l->next) total++;
    for(identlink *l = aliasstack; l != &noalias; l = l->next)
    {
        ident *id = l->id;
        ++depth;
        if(depth < dbgalias) conoutf(CON_ERROR, "  %d) %s", total-depth+1, id->name);
        else if(l->next == &noalias) conoutf(CON_ERROR, depth == dbgalias ? "  %d) %s" : "  ..%d) %s", total-depth+1, id->name);
    }
}